

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::WeightParams::InternalSwap(WeightParams *this,WeightParams *other)

{
  bool bVar1;
  intptr_t iVar2;
  void *pvVar3;
  QuantizationParams *pQVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long __tmp;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar7 = (this->floatvalue_).current_size_;
  iVar8 = (this->floatvalue_).total_size_;
  pvVar3 = (this->floatvalue_).arena_or_elements_;
  iVar6 = (other->floatvalue_).total_size_;
  pvVar5 = (other->floatvalue_).arena_or_elements_;
  (this->floatvalue_).current_size_ = (other->floatvalue_).current_size_;
  (this->floatvalue_).total_size_ = iVar6;
  (this->floatvalue_).arena_or_elements_ = pvVar5;
  (other->floatvalue_).current_size_ = iVar7;
  (other->floatvalue_).total_size_ = iVar8;
  (other->floatvalue_).arena_or_elements_ = pvVar3;
  pvVar3 = (other->float16value_).tagged_ptr_.ptr_;
  (other->float16value_).tagged_ptr_.ptr_ = (this->float16value_).tagged_ptr_.ptr_;
  (this->float16value_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->rawvalue_).tagged_ptr_.ptr_;
  (other->rawvalue_).tagged_ptr_.ptr_ = (this->rawvalue_).tagged_ptr_.ptr_;
  (this->rawvalue_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->int8rawvalue_).tagged_ptr_.ptr_;
  (other->int8rawvalue_).tagged_ptr_.ptr_ = (this->int8rawvalue_).tagged_ptr_.ptr_;
  (this->int8rawvalue_).tagged_ptr_.ptr_ = pvVar3;
  pQVar4 = this->quantization_;
  this->quantization_ = other->quantization_;
  other->quantization_ = pQVar4;
  bVar1 = this->isupdatable_;
  this->isupdatable_ = other->isupdatable_;
  other->isupdatable_ = bVar1;
  return;
}

Assistant:

void WeightParams::InternalSwap(WeightParams* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  floatvalue_.InternalSwap(&other->floatvalue_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &float16value_, lhs_arena,
      &other->float16value_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &rawvalue_, lhs_arena,
      &other->rawvalue_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &int8rawvalue_, lhs_arena,
      &other->int8rawvalue_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(WeightParams, isupdatable_)
      + sizeof(WeightParams::isupdatable_)
      - PROTOBUF_FIELD_OFFSET(WeightParams, quantization_)>(
          reinterpret_cast<char*>(&quantization_),
          reinterpret_cast<char*>(&other->quantization_));
}